

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viterbi.cpp
# Opt level: O1

bool MeCab::Viterbi::buildBestLattice(Lattice *lattice)

{
  int iVar1;
  undefined4 extraout_var;
  undefined8 *puVar2;
  undefined8 *puVar3;
  
  iVar1 = (*lattice->_vptr_Lattice[3])();
  puVar2 = (undefined8 *)CONCAT44(extraout_var,iVar1);
  for (puVar3 = *(undefined8 **)CONCAT44(extraout_var,iVar1); puVar3 != (undefined8 *)0x0;
      puVar3 = (undefined8 *)*puVar3) {
    *(undefined1 *)(puVar2 + 10) = 1;
    puVar3[1] = puVar2;
    puVar2 = puVar3;
  }
  return true;
}

Assistant:

bool Viterbi::buildBestLattice(Lattice *lattice) {
  Node *node = lattice->eos_node();
  for (Node *prev_node; node->prev;) {
    node->isbest = 1;
    prev_node = node->prev;
    prev_node->next = node;
    node = prev_node;
  }

  return true;
}